

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testInvalidUpdatableModelQuantizedBias(void)

{
  _Base_ptr *this;
  NeuralNetwork *pNVar1;
  ostream *poVar2;
  undefined1 local_110 [8];
  Result res;
  set<long,_std::less<long>,_std::allocator<long>_> local_b8;
  NeuralNetworkLayer *local_88;
  NeuralNetworkLayer *softmaxLayer;
  NeuralNetwork *local_70;
  NeuralNetwork *nn;
  TensorAttributes outTensorAttr;
  TensorAttributes inTensorAttr;
  undefined1 local_40 [8];
  Model m;
  
  CoreML::Specification::Model::Model((Model *)local_40);
  outTensorAttr._8_8_ = anon_var_dwarf_248cf;
  nn = (NeuralNetwork *)0x46213e;
  outTensorAttr.name = (char *)0x1;
  local_70 = buildBasicNeuralNetworkModel
                       ((Model *)local_40,true,(TensorAttributes *)&outTensorAttr.dimension,
                        (TensorAttributes *)&nn,1,false,true);
  local_88 = CoreML::Specification::NeuralNetwork::add_layers(local_70);
  CoreML::Specification::NeuralNetworkLayer::set_name(local_88,"softmax");
  CoreML::Specification::NeuralNetworkLayer::add_input(local_88,"B");
  CoreML::Specification::NeuralNetworkLayer::add_output(local_88,"softmax_out");
  CoreML::Specification::NeuralNetworkLayer::mutable_softmax(local_88);
  addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetwork>
            ((Model *)local_40,local_70,"cross_entropy_loss_layer","softmax_out","label_target");
  pNVar1 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_40);
  addLearningRate<CoreML::Specification::NeuralNetwork>
            (pNVar1,kSgdOptimizer,0.699999988079071,0.0,1.0);
  pNVar1 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_40);
  local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_b8._M_t._M_impl._0_8_ = 0;
  local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_b8);
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>(pNVar1,kSgdOptimizer,10,5,100,&local_b8);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_b8);
  pNVar1 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_40);
  res.m_message.super__Rb_tree_node_base._M_right = (_Base_ptr)0x0;
  res.m_message._M_storage._M_storage[0] = '\0';
  res.m_message._M_storage._M_storage[1] = '\0';
  res.m_message._M_storage._M_storage[2] = '\0';
  res.m_message._M_storage._M_storage[3] = '\0';
  res.m_message._M_storage._M_storage[4] = '\0';
  res.m_message._M_storage._M_storage[5] = '\0';
  res.m_message._M_storage._M_storage[6] = '\0';
  res.m_message._M_storage._M_storage[7] = '\0';
  this = &res.m_message.super__Rb_tree_node_base._M_right;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)this);
  addEpochs<CoreML::Specification::NeuralNetwork>
            (pNVar1,100,1,100,(set<long,_std::less<long>,_std::allocator<long>_> *)this);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)
             &res.m_message.super__Rb_tree_node_base._M_right);
  CoreML::Model::validate((Result *)local_110,(Model *)local_40);
  m._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_110);
  if (m._oneof_case_[0]._0_1_) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x346);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"!((res).good())");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_110);
  CoreML::Specification::Model::~Model((Model *)local_40);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidUpdatableModelQuantizedBias() {
    Specification::Model m;
    TensorAttributes inTensorAttr = { "A", 3 };
    TensorAttributes outTensorAttr = { "B", 1 };
    auto *nn = buildBasicNeuralNetworkModel(m, true, &inTensorAttr, &outTensorAttr, 1, false, true);

    // set a softmax layer
    auto softmaxLayer = nn->add_layers();
    softmaxLayer->set_name("softmax");
    softmaxLayer->add_input("B");
    softmaxLayer->add_output("softmax_out");
    softmaxLayer->mutable_softmax();

    // set a CCE loss layer
    addCategoricalCrossEntropyLoss(m, nn, "cross_entropy_loss_layer", "softmax_out", "label_target");

    // now add updatable model parameters.
    addLearningRate(m.mutable_neuralnetwork(), Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(m.mutable_neuralnetwork(), Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(m.mutable_neuralnetwork(), 100, 1, 100, std::set<int64_t>());

    // expect validation to fail.
    // "validator error: An updatable layer, named 'inner_layer', has quantized weights/bias param. Quantized weights/bias not supported for update."
    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);
    return 0;
}